

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O3

PmError Pm_Abort(PortMidiStream *stream)

{
  PmError PVar1;
  PmInternal *midi;
  
  PVar1 = pmBadPtr;
  if ((((stream != (PortMidiStream *)0x0) &&
       (PVar1 = pmBadPtr, descriptors[*stream].pub.output != 0)) &&
      (descriptors[*stream].pub.opened != 0)) &&
     (PVar1 = (**(code **)(*(long *)((long)stream + 0x50) + 0x40))(stream), PVar1 == pmHostError)) {
    (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100);
    pm_hosterror = 1;
    PVar1 = pmHostError;
  }
  return PVar1;
}

Assistant:

PMEXPORT PmError Pm_Abort( PortMidiStream* stream ) {
    PmInternal *midi = (PmInternal *) stream;
    PmError err;
    /* arg checking */
    if (midi == NULL)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.output)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else
        err = (*midi->dictionary->abort)(midi);

    if (err == pmHostError) {
        midi->dictionary->host_error(midi, pm_hosterror_text, 
                                     PM_HOST_ERROR_MSG_LEN);
        pm_hosterror = TRUE;
    }
    return pm_errmsg(err);
}